

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O2

void __thiscall cmCMakePresetsGraph::Preset::Preset(Preset *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Preset = (_func_int **)&PTR__Preset_0089e170;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Inherits).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Inherits).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Inherits).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->Inherits).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->DisplayName)._M_dataplus._M_p = (pointer)&(this->DisplayName).field_2;
  (this->DisplayName)._M_string_length = 0;
  (this->DisplayName).field_2._M_local_buf[0] = '\0';
  (this->Description)._M_dataplus._M_p = (pointer)&(this->Description).field_2;
  (this->Description)._M_string_length = 0;
  (this->Description).field_2._M_local_buf[0] = '\0';
  (this->ConditionEvaluator).
  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ConditionEvaluator).
  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ConditionResult = true;
  p_Var1 = &(this->Environment)._M_t._M_impl.super__Rb_tree_header;
  (this->Environment)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Environment)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Environment)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Environment)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Environment)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Preset() = default;